

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.h
# Opt level: O2

int __thiscall
SBPL2DGridSearch::getlowerboundoncostfromstart_inmm(SBPL2DGridSearch *this,int x,int y)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar3 = x / this->downsample_;
  iVar2 = y / this->downsample_;
  if (this->term_condition_usedlast == SBPL_2DGRIDSEARCH_TERM_CONDITION_OPTPATHFOUND) {
    uVar5 = iVar3 - this->goalX_;
    uVar1 = -uVar5;
    if (0 < (int)uVar5) {
      uVar1 = uVar5;
    }
    uVar6 = iVar2 - this->goalY_;
    uVar5 = -uVar6;
    if (0 < (int)uVar6) {
      uVar5 = uVar6;
    }
    if (uVar5 < uVar1) {
      uVar5 = uVar1;
    }
    iVar4 = (int)((float)(int)uVar5 * this->cellSize_m_ * 1000.0);
    if (this->searchStates2D_[iVar3][iVar2].iterationaccessed == this->iteration_) {
      iVar3 = this->searchStates2D_[iVar3][iVar2].g;
      iVar2 = this->largestcomputedoptf_;
      if (iVar3 + iVar4 <= iVar2) {
        return iVar3;
      }
    }
    else {
      iVar2 = this->largestcomputedoptf_;
    }
    iVar4 = iVar2 - iVar4;
    if (999999999 < iVar2) {
      iVar4 = 1000000000;
    }
    return iVar4;
  }
  if (this->searchStates2D_[iVar3][iVar2].iterationaccessed == this->iteration_) {
    iVar2 = this->searchStates2D_[iVar3][iVar2].g;
    iVar3 = this->largestcomputedoptf_;
    if (iVar2 < this->largestcomputedoptf_) {
      iVar3 = iVar2;
    }
    return iVar3;
  }
  return this->largestcomputedoptf_;
}

Assistant:

inline int getlowerboundoncostfromstart_inmm(int x, int y)
    {
        x /= downsample_; // local x
        y /= downsample_; // local y
        if (term_condition_usedlast == SBPL_2DGRIDSEARCH_TERM_CONDITION_OPTPATHFOUND) {
            //heuristic search
            int h = SBPL_2DGRIDSEARCH_HEUR2D(x,y);
            //the logic is that if s wasn't expanded, then g(s) + h(s) >=
            //maxcomputed_fval => g(s) >= maxcomputed_fval - h(s)
            return ((searchStates2D_[x][y].iterationaccessed == iteration_ &&
                    searchStates2D_[x][y].g + h <= largestcomputedoptf_)      ? searchStates2D_[x][y].g :
                    largestcomputedoptf_ < INFINITECOST                       ? largestcomputedoptf_ - h :
                                                                                INFINITECOST);
        }
        else {
            //Dijkstra's search
            //the logic is that if s wasn't expanded, then g(s) >= maxcomputed_fval => g(s) >= maxcomputed_fval - h(s)
            return ((searchStates2D_[x][y].iterationaccessed == iteration_ &&
                    searchStates2D_[x][y].g <= largestcomputedoptf_) ? searchStates2D_[x][y].g :
                    largestcomputedoptf_);
        }
    }